

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

void __thiscall simple_json::Stream::begin_json_object(Stream *this)

{
  _Elt_pointer ppVar1;
  bool local_d;
  Type local_c;
  
  ppVar1 = (this->stack).c.
           super__Deque_base<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar1 != (this->stack).c.
                super__Deque_base<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppVar1 == (this->stack).c.
                  super__Deque_base<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar1 = (this->stack).c.
               super__Deque_base<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if (ppVar1[-1].second == true) {
      spirv_cross::StringStream<4096UL,_4096UL>::operator<<(&this->buffer,",\n");
    }
  }
  statement<char_const(&)[2]>(this,(char (*) [2])"{");
  this->indent = this->indent + 1;
  local_c = Object;
  local_d = false;
  std::deque<std::pair<simple_json::Type,bool>,std::allocator<std::pair<simple_json::Type,bool>>>::
  emplace_back<simple_json::Type,bool>
            ((deque<std::pair<simple_json::Type,bool>,std::allocator<std::pair<simple_json::Type,bool>>>
              *)this,&local_c,&local_d);
  return;
}

Assistant:

void Stream::begin_json_object()
{
	if (!stack.empty() && stack.top().second)
	{
		statement_inner(",\n");
	}
	statement("{");
	++indent;
	stack.emplace(Type::Object, false);
}